

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_internal.h
# Opt level: O2

void __thiscall
ASDCP::MXF::TrackFileWriter<ASDCP::MXF::OP1aHeader>::InitHeader
          (TrackFileWriter<ASDCP::MXF::OP1aHeader> *this,MXFVersion *mxf_ver,
          vector<ASDCP::UL,_std::allocator<ASDCP::UL>_> *conformsToSpecifications)

{
  __normal_iterator<const_ASDCP::UL_*,_std::vector<ASDCP::UL,_std::allocator<ASDCP::UL>_>_> __first;
  __normal_iterator<const_ASDCP::UL_*,_std::vector<ASDCP::UL,_std::allocator<ASDCP::UL>_>_> __last;
  undefined8 uVar1;
  uint __line;
  Preface *this_00;
  undefined8 *puVar2;
  Identification *this_01;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  undefined2 uVar6;
  undefined2 uVar7;
  undefined1 auVar8 [16];
  int local_6c;
  vector<int,_std::allocator<int>_> version;
  
  if (this->m_Dict == (Dictionary *)0x0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_internal.h"
                  ,0x285,
                  "void ASDCP::MXF::TrackFileWriter<ASDCP::MXF::OP1aHeader>::InitHeader(const MXFVersion &, const std::vector<ASDCP::UL> *) [HeaderType = ASDCP::MXF::OP1aHeader]"
                 );
  }
  if (this->m_EssenceDescriptor == (FileDescriptor *)0x0) {
    __assert_fail("m_EssenceDescriptor",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_internal.h"
                  ,0x286,
                  "void ASDCP::MXF::TrackFileWriter<ASDCP::MXF::OP1aHeader>::InitHeader(const MXFVersion &, const std::vector<ASDCP::UL> *) [HeaderType = ASDCP::MXF::OP1aHeader]"
                 );
  }
  ASDCP::MXF::Primer::ClearTagList();
  this_00 = (Preface *)operator_new(0x260);
  ASDCP::MXF::Preface::Preface(this_00,this->m_Dict);
  *(Preface **)&this->field_0x260 = this_00;
  ASDCP::MXF::Partition::AddChildObject((InterchangeObject *)&this->m_HeaderPart);
  if (conformsToSpecifications != (vector<ASDCP::UL,_std::allocator<ASDCP::UL>_> *)0x0) {
    __first._M_current = *(UL **)conformsToSpecifications;
    __last._M_current = *(UL **)(conformsToSpecifications + 8);
    if (__last._M_current != __first._M_current) {
      lVar5 = *(long *)&this->field_0x260;
      *(undefined1 *)(lVar5 + 600) = 1;
      std::
      _Rb_tree<ASDCP::UL,ASDCP::UL,std::_Identity<ASDCP::UL>,std::less<ASDCP::UL>,std::allocator<ASDCP::UL>>
      ::
      _M_insert_range_unique<__gnu_cxx::__normal_iterator<ASDCP::UL_const*,std::vector<ASDCP::UL,std::allocator<ASDCP::UL>>>>
                ((_Rb_tree<ASDCP::UL,ASDCP::UL,std::_Identity<ASDCP::UL>,std::less<ASDCP::UL>,std::allocator<ASDCP::UL>>
                  *)(lVar5 + 0x220),__first,__last);
    }
  }
  puVar2 = (undefined8 *)ASDCP::Dictionary::Type((MDD_t)this->m_Dict);
  version.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)*puVar2;
  version.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)puVar2[1];
  lVar5 = *(long *)&this->field_0x260;
  *(undefined1 *)(lVar5 + 0x138) = 1;
  *(pointer *)(lVar5 + 0x139) =
       version.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  *(pointer *)(lVar5 + 0x141) =
       version.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  lVar5 = *(long *)&this->field_0x260;
  this->field_0x120 = *(undefined1 *)(lVar5 + 0x138);
  uVar1 = *(undefined8 *)(lVar5 + 0x141);
  *(undefined8 *)&this->field_0x121 = *(undefined8 *)(lVar5 + 0x139);
  *(undefined8 *)&this->field_0x129 = uVar1;
  if (*mxf_ver == MXFVersion_2004) {
    uVar6 = 0x102;
    uVar7 = 2;
  }
  else {
    if (*mxf_ver != MXFVersion_2011) {
      __assert_fail("mxf_ver == MXFVersion_2011",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_internal.h"
                    ,0x2a5,
                    "void ASDCP::MXF::TrackFileWriter<ASDCP::MXF::OP1aHeader>::InitHeader(const MXFVersion &, const std::vector<ASDCP::UL> *) [HeaderType = ASDCP::MXF::OP1aHeader]"
                   );
    }
    uVar6 = 0x103;
    uVar7 = 3;
  }
  *(undefined2 *)&this->field_0xd2 = uVar7;
  *(undefined2 *)(lVar5 + 0xb8) = uVar6;
  *(undefined4 *)(lVar5 + 0xbc) = 1;
  *(undefined1 *)(lVar5 + 0xc0) = 1;
  this_01 = (Identification *)operator_new(0x1d0);
  ASDCP::MXF::Identification::Identification(this_01,this->m_Dict);
  ASDCP::MXF::Partition::AddChildObject((InterchangeObject *)&this->m_HeaderPart);
  std::vector<Kumu::UUID,_std::allocator<Kumu::UUID>_>::push_back
            ((vector<Kumu::UUID,_std::allocator<Kumu::UUID>_> *)(*(long *)&this->field_0x260 + 0xf8)
             ,(value_type *)(this_01 + 0x58));
  Kumu::GenRandomValue((UUID *)(this_01 + 0xa0));
  ASDCP::MXF::UTF16String::operator=
            ((UTF16String *)(this_01 + 0xc0),(this->m_Info).CompanyName._M_dataplus._M_p);
  ASDCP::MXF::UTF16String::operator=
            ((UTF16String *)(this_01 + 0xe8),(this->m_Info).ProductName._M_dataplus._M_p);
  ASDCP::MXF::UTF16String::operator=
            ((UTF16String *)(this_01 + 0x128),(this->m_Info).ProductVersion._M_dataplus._M_p);
  this_01[0x158] = (Identification)0x1;
  uVar1 = *(undefined8 *)((this->m_Info).ProductUUID + 8);
  *(undefined8 *)(this_01 + 0x159) = *(undefined8 *)(this->m_Info).ProductUUID;
  *(undefined8 *)(this_01 + 0x161) = uVar1;
  ASDCP::MXF::UTF16String::UTF16String((UTF16String *)&version,"unix");
  optional_property<ASDCP::MXF::UTF16String>::operator=
            ((optional_property<ASDCP::MXF::UTF16String> *)(this_01 + 0x1a0),(UTF16String *)&version
            );
  std::__cxx11::string::~string
            ((string *)
             &version.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish);
  pcVar3 = (char *)ASDCP::Version();
  version.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  version.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  version.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pcVar4 = strchr(pcVar3,0x2e);
  do {
    if (pcVar4 == (char *)0x0) {
      if (*pcVar3 != '\0') {
        lVar5 = strtol(pcVar3,(char **)0x0,10);
        local_6c = (int)lVar5;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>(&version,&local_6c);
      }
      if ((long)version.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)version.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start == 0xc) {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = *(ulong *)version.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start;
        auVar8 = pshuflw(auVar8,auVar8,0xe8);
        *(int *)(this_01 + 400) = auVar8._0_4_;
        *(short *)(this_01 + 0x194) =
             (short)version.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[2];
        *(undefined2 *)(this_01 + 0x196) = 0x6a68;
        *(undefined4 *)(this_01 + 0x198) = 1;
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&version.super__Vector_base<int,_std::allocator<int>_>);
        return;
      }
      pcVar3 = "result.size() == 3";
      __line = 0x57;
LAB_0013fae3:
      __assert_fail(pcVar3,
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_DCP_internal.h"
                    ,__line,"std::vector<int> ASDCP::version_split(const char *)");
    }
    if (pcVar4 < pcVar3) {
      pcVar3 = "r >= pstr";
      __line = 0x4c;
      goto LAB_0013fae3;
    }
    if (pcVar3 < pcVar4) {
      lVar5 = strtol(pcVar3,(char **)0x0,10);
      local_6c = (int)lVar5;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(&version,&local_6c);
    }
    pcVar3 = pcVar4 + 1;
    pcVar4 = strchr(pcVar3,0x2e);
  } while( true );
}

Assistant:

void InitHeader(const MXFVersion& mxf_ver, const std::vector<ASDCP::UL>* conformsToSpecifications = NULL)
	{
	  assert(m_Dict);
	  assert(m_EssenceDescriptor);
 
	  m_HeaderPart.m_Primer.ClearTagList();
	  m_HeaderPart.m_Preface = new Preface(m_Dict);
	  m_HeaderPart.AddChildObject(m_HeaderPart.m_Preface);

		// add conformsToSpecifications, if it exists

		if (conformsToSpecifications && conformsToSpecifications->size() > 0) {

			m_HeaderPart.m_Preface->ConformsToSpecifications.set_has_value();

			m_HeaderPart.m_Preface->ConformsToSpecifications.get().insert(
				conformsToSpecifications->begin(),
				conformsToSpecifications->end()
			);
		}

	  // Set the Operational Pattern label -- we're just starting and have no RIP or index,
	  // so we tell the world by using OP1a
	  m_HeaderPart.m_Preface->OperationalPattern = UL(m_Dict->ul(MDD_OP1a));
	  m_HeaderPart.OperationalPattern = m_HeaderPart.m_Preface->OperationalPattern;

	  if ( mxf_ver == MXFVersion_2004 )
	    {
	      m_HeaderPart.MinorVersion = MXF_2004_MinorVersion;
	      m_HeaderPart.m_Preface->Version = ((MXF_ObjectModelVersion << 8) | MXF_2004_MinorVersion);
	      m_HeaderPart.m_Preface->ObjectModelVersion = MXF_ObjectModelVersion;
	    }
	  else
	    {
	      assert(mxf_ver == MXFVersion_2011);
	      m_HeaderPart.MinorVersion = MXF_2011_MinorVersion;
	      m_HeaderPart.m_Preface->Version = ((MXF_ObjectModelVersion << 8) | MXF_2011_MinorVersion);
	      m_HeaderPart.m_Preface->ObjectModelVersion = MXF_ObjectModelVersion;
	    }

	  // Identification
	  Identification* Ident = new Identification(m_Dict);
	  m_HeaderPart.AddChildObject(Ident);
	  m_HeaderPart.m_Preface->Identifications.push_back(Ident->InstanceUID);

	  Kumu::GenRandomValue(Ident->ThisGenerationUID);
	  Ident->CompanyName = m_Info.CompanyName.c_str();
	  Ident->ProductName = m_Info.ProductName.c_str();
	  Ident->VersionString = m_Info.ProductVersion.c_str();
	  Ident->ProductUID.Set(m_Info.ProductUUID);
	  Ident->Platform = ASDCP_PLATFORM;

	  std::vector<int> version = version_split(Version());

	  Ident->ToolkitVersion.Major = version[0];
	  Ident->ToolkitVersion.Minor = version[1];
	  Ident->ToolkitVersion.Patch = version[2];
	  Ident->ToolkitVersion.Build = ASDCP_BUILD_NUMBER;
	  Ident->ToolkitVersion.Release = VersionType::RL_RELEASE;
	}